

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

bool anon_unknown.dwarf_7a0cfe::ConditionHelper
               (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  Condition *pCVar3;
  Value *pVVar4;
  EqualsCondition *out_00;
  byte unaff_BPL;
  Condition *pCVar5;
  String type;
  String local_48;
  
  if (value == (Value *)0x0) {
    pCVar5 = (out->_M_t).
             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = (Condition *)0x0;
  }
  else {
    bVar1 = Json::Value::isBool(value);
    if (bVar1) {
      pCVar3 = (Condition *)operator_new(0x10);
      pCVar3->_vptr_Condition = (_func_int **)0x0;
      pCVar3[1]._vptr_Condition = (_func_int **)0x0;
      pCVar3->_vptr_Condition = (_func_int **)&PTR__Condition_00b33a20;
      bVar1 = Json::Value::asBool(value);
      *(bool *)&pCVar3[1]._vptr_Condition = bVar1;
      pCVar5 = (out->_M_t).
               super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
      (out->_M_t).
      super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
      .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = pCVar3;
    }
    else {
      bVar1 = Json::Value::isNull(value);
      if (!bVar1) {
        bVar1 = Json::Value::isObject(value);
        if (bVar1) {
          bVar1 = Json::Value::isMember(value,"type");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](value,"type");
            bVar1 = Json::Value::isString(pVVar4);
            if (bVar1) {
              pVVar4 = Json::Value::operator[](value,"type");
              Json::Value::asString_abi_cxx11_(&local_48,pVVar4);
              iVar2 = std::__cxx11::string::compare((char *)&local_48);
              if (iVar2 == 0) {
                out_00 = (EqualsCondition *)operator_new(0x10);
                (out_00->super_Condition)._vptr_Condition = (_func_int **)0x0;
                (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
                (out_00->super_Condition)._vptr_Condition = (_func_int **)&PTR__Condition_00b33a20;
                unaff_BPL = cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::ConstCondition>
                            ::operator()((Object<cmCMakePresetsGraphInternal::ConstCondition> *)
                                         (anonymous_namespace)::ConstConditionHelper,
                                         (ConstCondition *)out_00,value,state);
LAB_00271e84:
                if ((bool)unaff_BPL != false) {
                  pCVar5 = (out->_M_t).
                           super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                           _M_head_impl;
                  (out->_M_t).
                  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                       &out_00->super_Condition;
                  if (pCVar5 != (Condition *)0x0) {
                    (*pCVar5->_vptr_Condition[1])();
                  }
LAB_00272030:
                  unaff_BPL = true;
                  out_00 = (EqualsCondition *)0x0;
                }
LAB_00272033:
                if (out_00 != (EqualsCondition *)0x0) {
                  (*(out_00->super_Condition)._vptr_Condition[1])(out_00);
                }
                bVar1 = false;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_48);
                if (iVar2 == 0) {
LAB_00271d8f:
                  out_00 = (EqualsCondition *)operator_new(0x48);
                  (out_00->super_Condition)._vptr_Condition = (_func_int **)0x0;
                  (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
                  (out_00->Lhs)._M_string_length = 0;
                  (out_00->Lhs).field_2._M_allocated_capacity = 0;
                  *(undefined8 *)((long)(out_00->Lhs).field_2._M_local_buf + 8) = 0;
                  (out_00->Rhs)._M_dataplus._M_p = (pointer)0x0;
                  (out_00->Rhs)._M_string_length = 0;
                  (out_00->Rhs).field_2._M_allocated_capacity = 0;
                  *(undefined8 *)((long)(out_00->Rhs).field_2._M_local_buf + 8) = 0;
                  (out_00->super_Condition)._vptr_Condition =
                       (_func_int **)&PTR__EqualsCondition_00b33430;
                  (out_00->Lhs)._M_dataplus._M_p = (pointer)&(out_00->Lhs).field_2;
                  (out_00->Lhs)._M_string_length = 0;
                  (out_00->Lhs).field_2._M_local_buf[0] = '\0';
                  (out_00->Rhs)._M_dataplus._M_p = (pointer)&(out_00->Rhs).field_2;
                  (out_00->Rhs)._M_string_length = 0;
                  (out_00->Rhs).field_2._M_local_buf[0] = '\0';
                  unaff_BPL = cmJSONHelperBuilder::
                              Object<cmCMakePresetsGraphInternal::EqualsCondition>::operator()
                                        ((Object<cmCMakePresetsGraphInternal::EqualsCondition> *)
                                         (anonymous_namespace)::EqualsConditionHelper,out_00,value,
                                         state);
                  if ((bool)unaff_BPL) {
                    pCVar5 = (out->_M_t).
                             super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                             .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                             _M_head_impl;
                    (out->_M_t).
                    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                         (Condition *)out_00;
                    if (pCVar5 != (Condition *)0x0) {
                      (*pCVar5->_vptr_Condition[1])();
                    }
                    iVar2 = std::__cxx11::string::compare((char *)&local_48);
                    if (iVar2 == 0) {
                      pCVar5 = (out->_M_t).
                               super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                               .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                               _M_head_impl;
                      (out->_M_t).
                      super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                      .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                           (Condition *)0x0;
                      pCVar3 = (Condition *)operator_new(0x10);
                      goto LAB_00272015;
                    }
                    goto LAB_00272030;
                  }
                  goto LAB_00272033;
                }
                iVar2 = std::__cxx11::string::compare((char *)&local_48);
                if (iVar2 == 0) goto LAB_00271d8f;
                iVar2 = std::__cxx11::string::compare((char *)&local_48);
                if (iVar2 == 0) {
LAB_00271eab:
                  out_00 = (EqualsCondition *)operator_new(0x40);
                  (out_00->super_Condition)._vptr_Condition = (_func_int **)0x0;
                  (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
                  (out_00->Lhs)._M_string_length = 0;
                  (out_00->Lhs).field_2._M_allocated_capacity = 0;
                  (out_00->Rhs)._M_string_length = 0;
                  (out_00->Rhs).field_2._M_allocated_capacity = 0;
                  *(undefined8 *)((long)(out_00->Lhs).field_2._M_local_buf + 8) = 0;
                  (out_00->Rhs)._M_dataplus._M_p = (pointer)0x0;
                  (out_00->super_Condition)._vptr_Condition =
                       (_func_int **)&PTR__InListCondition_00b33478;
                  (out_00->Lhs)._M_dataplus._M_p = (pointer)&(out_00->Lhs).field_2;
                  (out_00->Lhs)._M_string_length = 0;
                  (out_00->Lhs).field_2._M_local_buf[0] = '\0';
                  (out_00->Rhs)._M_dataplus._M_p = (pointer)0x0;
                  (out_00->Rhs)._M_string_length = 0;
                  (out_00->Rhs).field_2._M_allocated_capacity = 0;
                  unaff_BPL = cmJSONHelperBuilder::
                              Object<cmCMakePresetsGraphInternal::InListCondition>::operator()
                                        ((Object<cmCMakePresetsGraphInternal::InListCondition> *)
                                         (anonymous_namespace)::InListConditionHelper,
                                         (InListCondition *)out_00,value,state);
                  if (!(bool)unaff_BPL) goto LAB_00272033;
                  pCVar5 = (out->_M_t).
                           super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                           _M_head_impl;
                  (out->_M_t).
                  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                       (Condition *)out_00;
                  if (pCVar5 != (Condition *)0x0) {
                    (*pCVar5->_vptr_Condition[1])();
                  }
                  iVar2 = std::__cxx11::string::compare((char *)&local_48);
                  if (iVar2 != 0) goto LAB_00272030;
                  pCVar5 = (out->_M_t).
                           super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                           _M_head_impl;
                  (out->_M_t).
                  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                       (Condition *)0x0;
                  pCVar3 = (Condition *)operator_new(0x10);
LAB_00272015:
                  pCVar3->_vptr_Condition = (_func_int **)0x0;
                  pCVar3[1]._vptr_Condition = (_func_int **)0x0;
                  pCVar3->_vptr_Condition = (_func_int **)&PTR__NotCondition_00b33550;
                  pCVar3[1]._vptr_Condition = (_func_int **)pCVar5;
                  (out->_M_t).
                  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                       pCVar3;
                  goto LAB_00272030;
                }
                iVar2 = std::__cxx11::string::compare((char *)&local_48);
                if (iVar2 == 0) goto LAB_00271eab;
                iVar2 = std::__cxx11::string::compare((char *)&local_48);
                if (iVar2 == 0) {
LAB_00271f60:
                  out_00 = (EqualsCondition *)operator_new(0x48);
                  (out_00->super_Condition)._vptr_Condition = (_func_int **)0x0;
                  (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
                  (out_00->Lhs)._M_string_length = 0;
                  (out_00->Lhs).field_2._M_allocated_capacity = 0;
                  *(undefined8 *)((long)(out_00->Lhs).field_2._M_local_buf + 8) = 0;
                  (out_00->Rhs)._M_dataplus._M_p = (pointer)0x0;
                  (out_00->Rhs)._M_string_length = 0;
                  (out_00->Rhs).field_2._M_allocated_capacity = 0;
                  *(undefined8 *)((long)(out_00->Rhs).field_2._M_local_buf + 8) = 0;
                  (out_00->super_Condition)._vptr_Condition =
                       (_func_int **)&PTR__MatchesCondition_00b334c0;
                  (out_00->Lhs)._M_dataplus._M_p = (pointer)&(out_00->Lhs).field_2;
                  (out_00->Lhs)._M_string_length = 0;
                  (out_00->Lhs).field_2._M_local_buf[0] = '\0';
                  (out_00->Rhs)._M_dataplus._M_p = (pointer)&(out_00->Rhs).field_2;
                  (out_00->Rhs)._M_string_length = 0;
                  (out_00->Rhs).field_2._M_local_buf[0] = '\0';
                  unaff_BPL = cmJSONHelperBuilder::
                              Object<cmCMakePresetsGraphInternal::MatchesCondition>::operator()
                                        ((Object<cmCMakePresetsGraphInternal::MatchesCondition> *)
                                         (anonymous_namespace)::MatchesConditionHelper,
                                         (MatchesCondition *)out_00,value,state);
                  if (!(bool)unaff_BPL) goto LAB_00272033;
                  pCVar5 = (out->_M_t).
                           super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                           _M_head_impl;
                  (out->_M_t).
                  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                       (Condition *)out_00;
                  if (pCVar5 != (Condition *)0x0) {
                    (*pCVar5->_vptr_Condition[1])();
                  }
                  iVar2 = std::__cxx11::string::compare((char *)&local_48);
                  if (iVar2 != 0) goto LAB_00272030;
                  pCVar5 = (out->_M_t).
                           super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                           _M_head_impl;
                  (out->_M_t).
                  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
                       (Condition *)0x0;
                  pCVar3 = (Condition *)operator_new(0x10);
                  goto LAB_00272015;
                }
                iVar2 = std::__cxx11::string::compare((char *)&local_48);
                if (iVar2 == 0) goto LAB_00271f60;
                iVar2 = std::__cxx11::string::compare((char *)&local_48);
                if (iVar2 == 0) {
LAB_00272085:
                  out_00 = (EqualsCondition *)operator_new(0x28);
                  (out_00->super_Condition)._vptr_Condition = (_func_int **)0x0;
                  (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
                  (out_00->Lhs)._M_string_length = 0;
                  (out_00->Lhs).field_2._M_allocated_capacity = 0;
                  *(undefined8 *)((long)&(out_00->Lhs).field_2 + 8) = 0;
                  (out_00->super_Condition)._vptr_Condition =
                       (_func_int **)&PTR__AnyAllOfCondition_00b33508;
                  (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
                  (out_00->Lhs)._M_string_length = 0;
                  (out_00->Lhs).field_2._M_allocated_capacity = 0;
                  iVar2 = std::__cxx11::string::compare((char *)&local_48);
                  (out_00->Lhs).field_2._M_local_buf[8] = iVar2 == 0;
                  unaff_BPL = cmJSONHelperBuilder::
                              Object<cmCMakePresetsGraphInternal::AnyAllOfCondition>::operator()
                                        ((Object<cmCMakePresetsGraphInternal::AnyAllOfCondition> *)
                                         (anonymous_namespace)::AnyAllOfConditionHelper,
                                         (AnyAllOfCondition *)out_00,value,state);
                  goto LAB_00271e84;
                }
                iVar2 = std::__cxx11::string::compare((char *)&local_48);
                if (iVar2 == 0) goto LAB_00272085;
                iVar2 = std::__cxx11::string::compare((char *)&local_48);
                if (iVar2 == 0) {
                  out_00 = (EqualsCondition *)operator_new(0x10);
                  (out_00->super_Condition)._vptr_Condition = (_func_int **)0x0;
                  (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
                  (out_00->super_Condition)._vptr_Condition =
                       (_func_int **)&PTR__NotCondition_00b33550;
                  (out_00->Lhs)._M_dataplus._M_p = (pointer)0x0;
                  unaff_BPL = cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::NotCondition>
                              ::operator()((Object<cmCMakePresetsGraphInternal::NotCondition> *)
                                           (anonymous_namespace)::NotConditionHelper,
                                           (NotCondition *)out_00,value,state);
                  goto LAB_00271e84;
                }
                bVar1 = true;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_48._M_dataplus._M_p != &local_48.field_2) {
                operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1
                               );
              }
              if (!bVar1) goto LAB_00272072;
            }
          }
        }
        cmCMakePresetsErrors::INVALID_CONDITION(value,state);
        unaff_BPL = 0;
        goto LAB_00272072;
      }
      pCVar3 = (Condition *)operator_new(8);
      pCVar3->_vptr_Condition = (_func_int **)&PTR__Condition_00b33a68;
      pCVar5 = (out->_M_t).
               super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
      (out->_M_t).
      super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
      .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl = pCVar3;
    }
  }
  unaff_BPL = 1;
  if (pCVar5 != (Condition *)0x0) {
    (*pCVar5->_vptr_Condition[1])();
  }
LAB_00272072:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ConditionHelper(std::unique_ptr<cmCMakePresetsGraph::Condition>& out,
                     const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    out.reset();
    return true;
  }

  if (value->isBool()) {
    auto c = cm::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
    c->Value = value->asBool();
    out = std::move(c);
    return true;
  }

  if (value->isNull()) {
    out = cm::make_unique<cmCMakePresetsGraphInternal::NullCondition>();
    return true;
  }

  if (value->isObject()) {
    if (!value->isMember("type")) {
      cmCMakePresetsErrors::INVALID_CONDITION(value, state);
      return false;
    }

    if (!(*value)["type"].isString()) {
      cmCMakePresetsErrors::INVALID_CONDITION(value, state);
      return false;
    }
    auto type = (*value)["type"].asString();

    if (type == "const") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
      CHECK_OK(ConstConditionHelper(*c, value, state));
      out = std::move(c);
      return true;
    }

    if (type == "equals" || type == "notEquals") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::EqualsCondition>();
      CHECK_OK(EqualsConditionHelper(*c, value, state));
      out = std::move(c);
      if (type == "notEquals") {
        out = InvertCondition(std::move(out));
      }
      return true;
    }

    if (type == "inList" || type == "notInList") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::InListCondition>();
      CHECK_OK(InListConditionHelper(*c, value, state));
      out = std::move(c);
      if (type == "notInList") {
        out = InvertCondition(std::move(out));
      }
      return true;
    }

    if (type == "matches" || type == "notMatches") {
      auto c =
        cm::make_unique<cmCMakePresetsGraphInternal::MatchesCondition>();
      CHECK_OK(MatchesConditionHelper(*c, value, state));
      out = std::move(c);
      if (type == "notMatches") {
        out = InvertCondition(std::move(out));
      }
      return true;
    }

    if (type == "anyOf" || type == "allOf") {
      auto c =
        cm::make_unique<cmCMakePresetsGraphInternal::AnyAllOfCondition>();
      c->StopValue = (type == "anyOf");
      CHECK_OK(AnyAllOfConditionHelper(*c, value, state));
      out = std::move(c);
      return true;
    }

    if (type == "not") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::NotCondition>();
      CHECK_OK(NotConditionHelper(*c, value, state));
      out = std::move(c);
      return true;
    }
  }

  cmCMakePresetsErrors::INVALID_CONDITION(value, state);
  return false;
}